

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_comp.cpp
# Opt level: O3

void __thiscall
basisu::basis_compressor::get_dfd(basis_compressor *this,uint8_vec *dfd,ktx2_header *header)

{
  bool bVar1;
  undefined4 uVar2;
  uchar *puVar3;
  uint uVar4;
  uint uVar5;
  undefined1 *puVar6;
  size_t __n;
  undefined1 *__src;
  uint32_t new_size;
  uint uVar7;
  
  bVar1 = this->m_any_source_image_has_alpha;
  puVar6 = g_ktx2_uastc_nonalpha_dfd;
  __n = (ulong)bVar1 << 4 | 0x2c;
  if (bVar1 != false) {
    puVar6 = g_ktx2_uastc_alpha_dfd;
  }
  __src = g_ktx2_etc1s_nonalpha_dfd;
  if (bVar1 != false) {
    __src = g_ktx2_etc1s_alpha_dfd;
  }
  if ((this->m_params).m_uastc.m_value != false) {
    __src = puVar6;
    __n = 0x2c;
  }
  uVar4 = dfd->m_size;
  uVar7 = (uint)__n;
  if (uVar4 != uVar7) {
    if (uVar4 <= uVar7) {
      if (dfd->m_capacity < uVar7) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)dfd,uVar7,uVar4 + 1 == uVar7,1,(object_mover)0x0,false);
        uVar4 = dfd->m_size;
      }
      memset(dfd->m_p + uVar4,0,(ulong)(uVar7 - uVar4));
    }
    dfd->m_size = uVar7;
  }
  memcpy(dfd->m_p,__src,__n);
  puVar3 = dfd->m_p;
  uVar2 = *(undefined4 *)(puVar3 + 0xc);
  bVar1 = (this->m_params).m_ktx2_srgb_transfer_func.m_value;
  puVar3[0xc] = (uchar)uVar2;
  puVar3[0xd] = (uchar)((uint)uVar2 >> 8);
  puVar3[0xe] = bVar1 + '\x01';
  puVar3[0xf] = (uchar)((uint)uVar2 >> 0x18);
  if (*(int *)(header->m_supercompression_scheme).m_bytes != 0) {
    puVar3 = dfd->m_p;
    uVar2 = *(undefined4 *)(puVar3 + 0x14);
    puVar3[0x14] = '\0';
    puVar3[0x15] = (uchar)((uint)uVar2 >> 8);
    puVar3[0x16] = (uchar)((uint)uVar2 >> 0x10);
    puVar3[0x17] = (uchar)((uint)uVar2 >> 0x18);
  }
  uVar4 = *(uint *)(dfd->m_p + 0x1c);
  uVar5 = uVar4 & 0xf0ffffff;
  uVar7 = uVar5 + 0x3000000;
  if ((this->m_any_source_image_has_alpha & 1U) == 0) {
    uVar7 = uVar5;
  }
  if ((this->m_params).m_uastc.m_value == false) {
    uVar7 = uVar4;
  }
  *(uint *)(dfd->m_p + 0x1c) = uVar7;
  return;
}

Assistant:

void basis_compressor::get_dfd(uint8_vec &dfd, const basist::ktx2_header &header)
	{
		const uint8_t* pDFD;
		uint32_t dfd_len;

		if (m_params.m_uastc)
		{
			if (m_any_source_image_has_alpha)
			{
				pDFD = g_ktx2_uastc_alpha_dfd;
				dfd_len = sizeof(g_ktx2_uastc_alpha_dfd);
			}
			else
			{
				pDFD = g_ktx2_uastc_nonalpha_dfd;
				dfd_len = sizeof(g_ktx2_uastc_nonalpha_dfd);
			}
		}
		else
		{
			if (m_any_source_image_has_alpha)
			{
				pDFD = g_ktx2_etc1s_alpha_dfd;
				dfd_len = sizeof(g_ktx2_etc1s_alpha_dfd);
			}
			else
			{
				pDFD = g_ktx2_etc1s_nonalpha_dfd;
				dfd_len = sizeof(g_ktx2_etc1s_nonalpha_dfd);
			}
		}
				
		assert(dfd_len >= 44);

		dfd.resize(dfd_len);
		memcpy(dfd.data(), pDFD, dfd_len);

		uint32_t dfd_bits = basisu::read_le_dword(dfd.data() + 3 * sizeof(uint32_t));
		
		dfd_bits &= ~(0xFF << 16);

		if (m_params.m_ktx2_srgb_transfer_func)
			dfd_bits |= (basist::KTX2_KHR_DF_TRANSFER_SRGB << 16);
		else
			dfd_bits |= (basist::KTX2_KHR_DF_TRANSFER_LINEAR << 16);

		basisu::write_le_dword(dfd.data() + 3 * sizeof(uint32_t), dfd_bits);

		if (header.m_supercompression_scheme != basist::KTX2_SS_NONE)
		{
			uint32_t plane_bits = basisu::read_le_dword(dfd.data() + 5 * sizeof(uint32_t));

			plane_bits &= ~0xFF;

			basisu::write_le_dword(dfd.data() + 5 * sizeof(uint32_t), plane_bits);
		}

		// Fix up the DFD channel(s)
		uint32_t dfd_chan0 = basisu::read_le_dword(dfd.data() + 7 * sizeof(uint32_t));

		if (m_params.m_uastc)
		{
			dfd_chan0 &= ~(0xF << 24);
			
			// TODO: Allow the caller to override this
			if (m_any_source_image_has_alpha)
				dfd_chan0 |= (basist::KTX2_DF_CHANNEL_UASTC_RGBA << 24);
			else
				dfd_chan0 |= (basist::KTX2_DF_CHANNEL_UASTC_RGB << 24);
		}

		basisu::write_le_dword(dfd.data() + 7 * sizeof(uint32_t), dfd_chan0);
	}